

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O0

ostream * boost::unit_test::utils::operator<<
                    (custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::attr_value_t>_>
                     *p,char (*value) [6])

{
  ostream *poVar1;
  ostream *in_RSI;
  custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::attr_value_t>_>
  *in_RDI;
  char (*in_stack_ffffffffffffffe8) [6];
  
  poVar1 = custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::attr_value_t>_>
           ::operator*(in_RDI);
  std::operator<<(poVar1,"=\"");
  custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::attr_value_t>_>::
  operator*(in_RDI);
  print_escaped<char[6]>(in_RSI,in_stack_ffffffffffffffe8);
  poVar1 = custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::attr_value_t>_>
           ::operator*(in_RDI);
  std::operator<<(poVar1,'\"');
  poVar1 = custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::attr_value_t>_>
           ::operator*(in_RDI);
  return poVar1;
}

Assistant:

inline std::ostream&
operator<<( custom_printer<attr_value> const& p, T const& value )
{
    *p << "=\"";
    print_escaped( *p, value );
    *p << '"';

    return *p;
}